

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lexicon.h
# Opt level: O3

void __thiscall
SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::SequenceLexicon
          (SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_> *this,hash<int> *hasher,
          equal_to<int> *key_equal)

{
  iterator __position;
  uint local_1c;
  
  (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .super_IdHasher.lexicon_ = this;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .use_empty_ = false;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .use_deleted_ = false;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .num_ht_copies_ = 0;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .enlarge_factor_ = 0.5;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .shrink_factor_ = 0.2;
  (this->id_set_).rep.key_info.super_IdKeyEqual.lexicon_ = this;
  (this->id_set_).rep.key_info.delkey = 0;
  (this->id_set_).rep.key_info.empty = 0;
  (this->id_set_).rep.num_deleted = 0;
  (this->id_set_).rep.num_elements = 0;
  (this->id_set_).rep.num_buckets = 0x20;
  (this->id_set_).rep.table = (pointer)0x0;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .enlarge_threshold_ = 0x10;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .shrink_threshold_ = 6;
  (this->id_set_).rep.settings.
  super_sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
  .consider_shrink_ = false;
  gtl::
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  ::set_empty_key(&(this->id_set_).rep,&kEmptyKey);
  local_1c = 0;
  __position._M_current =
       (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&this->begins_,__position,&local_1c);
  }
  else {
    *__position._M_current = 0;
    (this->begins_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

SequenceLexicon<T, Hasher, KeyEqual>::SequenceLexicon(const Hasher& hasher,
                                                      const KeyEqual& key_equal)
    : id_set_(0, IdHasher(hasher, this),
              IdKeyEqual(key_equal, this)) {
  id_set_.set_empty_key(kEmptyKey);
  begins_.push_back(0);
}